

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

VerificationResult * __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseCase::verifyMessageCount
          (VerificationResult *__return_storage_ptr__,BaseCase *this,MessageID *id,GLenum severity,
          int refCount,int resCount,bool messageEnabled)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  VerificationResult *pVVar4;
  stringstream log;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1f8._M_string_length._0_4_ = SUB84(id,0);
  if (resCount == 0) {
    if (refCount == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Message was excluded correctly:  (",0x22);
      poVar3 = anon_unknown_1::operator<<((ostream *)local_1a8,(MessageID *)this);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") with ",7);
      local_1f8._M_dataplus._M_p = (pointer)glu::getDebugMessageSeverityName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1f8,poVar3);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,0x1af8059);
      std::__cxx11::stringbuf::str();
      VerificationResult::VerificationResult
                (__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_1f8,&local_1d8);
    }
    else if (severity == 0 && 0 < refCount) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"A message was not excluded as it should have been: (",0x34);
      poVar3 = anon_unknown_1::operator<<((ostream *)local_1a8,(MessageID *)this);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") with ",7);
      local_1f8._M_dataplus._M_p = (pointer)glu::getDebugMessageSeverityName;
      poVar3 = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1f8,poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,". This message was not present in the reference run",0x33);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"A message was not filtered out","");
      std::__cxx11::stringbuf::str();
      VerificationResult::VerificationResult
                (__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_1f8,&local_1d8);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"A message was not excluded as it should have been: (",0x34);
      poVar3 = anon_unknown_1::operator<<((ostream *)local_1a8,(MessageID *)this);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") with ",7);
      local_1f8._M_dataplus._M_p = (pointer)glu::getDebugMessageSeverityName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1f8,poVar3);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"A message was not filtered out","");
      std::__cxx11::stringbuf::str();
      VerificationResult::VerificationResult
                (__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_1f8,&local_1d8);
    }
    goto LAB_013ad042;
  }
  if (refCount == severity) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Message was found when expected: (",0x22);
    poVar3 = anon_unknown_1::operator<<((ostream *)local_1a8,(MessageID *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") with ",7);
    local_1f8._M_dataplus._M_p = (pointer)glu::getDebugMessageSeverityName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1f8,poVar3);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,0x1af8059);
    std::__cxx11::stringbuf::str();
    VerificationResult::VerificationResult
              (__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_1f8,&local_1d8);
    goto LAB_013ad042;
  }
  iVar2 = *(int *)&(this->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode.
                   _vptr_TestNode;
  uVar1 = iVar2 - 0x8246;
  if (5 < uVar1) {
LAB_013ace5d:
    if ((int)severity < refCount) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Extra instances of message were found but the message is non-deterministic(warning): ("
                 ,0x56);
      poVar3 = anon_unknown_1::operator<<((ostream *)local_1a8,(MessageID *)this);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") with ",7);
      local_1f8._M_dataplus._M_p = (pointer)glu::getDebugMessageSeverityName;
      poVar3 = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1f8,poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," (got ",6);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,refCount);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", expected ",0xb);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,severity);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"Extra instances of a message were present","");
      std::__cxx11::stringbuf::str();
      VerificationResult::VerificationResult
                (__return_storage_ptr__,QP_TEST_RESULT_QUALITY_WARNING,&local_1f8,&local_1d8);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Instances of message were missing but the message is non-deterministic(warning): ("
                 ,0x52);
      poVar3 = anon_unknown_1::operator<<((ostream *)local_1a8,(MessageID *)this);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") with ",7);
      local_1f8._M_dataplus._M_p = (pointer)glu::getDebugMessageSeverityName;
      poVar3 = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1f8,poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," (got ",6);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,refCount);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", expected ",0xb);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,severity);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Message missing","");
      std::__cxx11::stringbuf::str();
      VerificationResult::VerificationResult
                (__return_storage_ptr__,QP_TEST_RESULT_QUALITY_WARNING,&local_1f8,&local_1d8);
    }
    goto LAB_013ad042;
  }
  if ((5U >> (uVar1 & 0x1f) & 1) == 0) {
    if ((0x18U >> (uVar1 & 0x1f) & 1) != 0) {
LAB_013acb81:
      if ((int)severity < refCount) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Extra instances of message were found: (",0x28);
        poVar3 = anon_unknown_1::operator<<((ostream *)local_1a8,(MessageID *)this);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,") with ",7);
        local_1f8._M_dataplus._M_p = (pointer)glu::getDebugMessageSeverityName;
        poVar3 = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1f8,poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," (got ",6);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,refCount);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", expected ",0xb);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,severity);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f8,"Extra instances of a deterministic message were present",""
                  );
        std::__cxx11::stringbuf::str();
        VerificationResult::VerificationResult
                  (__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_1f8,&local_1d8);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Instances of message were missing: (",0x24);
        poVar3 = anon_unknown_1::operator<<((ostream *)local_1a8,(MessageID *)this);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,") with ",7);
        local_1f8._M_dataplus._M_p = (pointer)glu::getDebugMessageSeverityName;
        poVar3 = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1f8,poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," (got ",6);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,refCount);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", expected ",0xb);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,severity);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Message missing","");
        std::__cxx11::stringbuf::str();
        VerificationResult::VerificationResult
                  (__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_1f8,&local_1d8);
      }
      goto LAB_013ad042;
    }
  }
  else {
    if (*(int *)((long)&(this->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode.
                        _vptr_TestNode + 4) == 0x824c) goto LAB_013acb81;
    if (iVar2 != 0x8247) goto LAB_013ace5d;
  }
  if ((int)severity < refCount) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Extra instances of message were found but the message is non-deterministic(ignored): ("
               ,0x56);
    poVar3 = anon_unknown_1::operator<<((ostream *)local_1a8,(MessageID *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") with ",7);
    local_1f8._M_dataplus._M_p = (pointer)glu::getDebugMessageSeverityName;
    poVar3 = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1f8,poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (got ",6);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,refCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", expected ",0xb);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,severity);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,0x1af8059);
    std::__cxx11::stringbuf::str();
    VerificationResult::VerificationResult
              (__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_1f8,&local_1d8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Instances of message were missing but the message is non-deterministic(ignored): (",
               0x52);
    poVar3 = anon_unknown_1::operator<<((ostream *)local_1a8,(MessageID *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") with ",7);
    local_1f8._M_dataplus._M_p = (pointer)glu::getDebugMessageSeverityName;
    poVar3 = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1f8,poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (got ",6);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,refCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", expected ",0xb);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,severity);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,0x1af8059);
    std::__cxx11::stringbuf::str();
    VerificationResult::VerificationResult
              (__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_1f8,&local_1d8);
  }
LAB_013ad042:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  pVVar4 = (VerificationResult *)std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return pVVar4;
}

Assistant:

BaseCase::VerificationResult BaseCase::verifyMessageCount (const MessageID& id, GLenum severity, int refCount, int resCount, bool messageEnabled) const
{
	std::stringstream log;

	// This message should not be filtered out
	if (messageEnabled)
	{
		if (resCount != refCount)
		{
			/*
			 * Technically nothing requires the implementation to be consistent in terms
			 * of the messages it produces in most situations, allowing the set of messages
			 * produced to vary between executions. This function splits messages
			 * into deterministic and non-deterministic to facilitate handling of such messages.
			 *
			 * Non-deterministic messages that are present in differing quantities in filtered and
			 * unfiltered runs will not fail the test case unless in direct violation of a filter:
			 * the implementation may produce an arbitrary number of such messages when they are
			 * not filtered out and none when they are filtered.
			 *
			 * A list of error source/type combinations with their assumed behaviour and
			 * the rationale for expecting such behaviour follows
			 *
			 * For API/shader messages we assume that the following types are deterministic:
			 *   DEBUG_TYPE_ERROR                 Errors specified by spec and should always be produced
			 *
			 * For API messages the following types are assumed to be non-deterministic
			 * and treated as quality warnings since the underlying reported issue does not change between calls:
			 *   DEBUG_TYPE_DEPRECATED_BEHAVIOR   Reasonable to only report first instance
             *   DEBUG_TYPE_UNDEFINED_BEHAVIOR    Reasonable to only report first instance
             *   DEBUG_TYPE_PORTABILITY           Reasonable to only report first instance
			 *
			 * For API messages the following types are assumed to be non-deterministic
			 * and do not affect test results.
			 *   DEBUG_TYPE_PERFORMANCE           May be tied to arbitrary factors, reasonable to report only first instance
             *   DEBUG_TYPE_OTHER                 Definition allows arbitrary contents
			 *
			 * For 3rd party and application messages the following types are deterministic:
             *   DEBUG_TYPE_MARKER                Only generated by test
			 *   DEBUG_TYPE_PUSH_GROUP            Only generated by test
			 *   DEBUG_TYPE_POP_GROUP             Only generated by test
			 *   All others                       Only generated by test
			 *
			 * All messages with category of window system or other are treated as non-deterministic
			 * and do not effect test results since they can be assumed to be outside control of
			 * both the implementation and test case
			 *
			 */

			const bool isDeterministic	= id.source == GL_DEBUG_SOURCE_APPLICATION ||
										  id.source == GL_DEBUG_SOURCE_THIRD_PARTY ||
										  ((id.source == GL_DEBUG_SOURCE_API || id.source == GL_DEBUG_SOURCE_SHADER_COMPILER) && id.type == GL_DEBUG_TYPE_ERROR);

			const bool canIgnore		= id.source == GL_DEBUG_SOURCE_WINDOW_SYSTEM || id.source == GL_DEBUG_SOURCE_OTHER;

			if (isDeterministic)
			{
				if (resCount > refCount)
				{
					log << "Extra instances of message were found: (" << id << ") with "
						<< glu::getDebugMessageSeverityStr(severity)
						<< " (got " << resCount << ", expected " << refCount << ")";
					return VerificationResult(QP_TEST_RESULT_FAIL, "Extra instances of a deterministic message were present", log.str());
				}
				else
				{
					log << "Instances of message were missing: (" << id << ") with "
						<< glu::getDebugMessageSeverityStr(severity)
						<< " (got " << resCount << ", expected " << refCount << ")";
					return VerificationResult(QP_TEST_RESULT_FAIL, "Message missing", log.str());
				}
			}
			else if(!canIgnore)
			{
				if (resCount > refCount)
				{
					log << "Extra instances of message were found but the message is non-deterministic(warning): (" << id << ") with "
						<< glu::getDebugMessageSeverityStr(severity)
						<< " (got " << resCount << ", expected " << refCount << ")";
					return VerificationResult(QP_TEST_RESULT_QUALITY_WARNING, "Extra instances of a message were present", log.str());
				}
				else
				{
					log << "Instances of message were missing but the message is non-deterministic(warning): (" << id << ") with "
						<< glu::getDebugMessageSeverityStr(severity)
						<< " (got " << resCount << ", expected " << refCount << ")";
					return VerificationResult(QP_TEST_RESULT_QUALITY_WARNING, "Message missing", log.str());
				}
			}
			else
			{
				if (resCount > refCount)
				{
					log << "Extra instances of message were found but the message is non-deterministic(ignored): (" << id << ") with "
						<< glu::getDebugMessageSeverityStr(severity)
						<< " (got " << resCount << ", expected " << refCount << ")";
					return VerificationResult(QP_TEST_RESULT_PASS, "", log.str());
				}
				else
				{
					log << "Instances of message were missing but the message is non-deterministic(ignored): (" << id << ") with "
						<< glu::getDebugMessageSeverityStr(severity)
						<< " (got " << resCount << ", expected " << refCount << ")";
					return VerificationResult(QP_TEST_RESULT_PASS, "", log.str());
				}
			}
		}
		else // Passed as appropriate
		{
			log << "Message was found when expected: ("<< id << ") with "
				<< glu::getDebugMessageSeverityStr(severity);
			return VerificationResult(QP_TEST_RESULT_PASS, "", log.str());
		}
	}
	// Message should be filtered out
	else
	{
		// Filtered out
		if (resCount == 0)
		{
			log << "Message was excluded correctly:  (" << id << ") with "
				<< glu::getDebugMessageSeverityStr(severity);
			return VerificationResult(QP_TEST_RESULT_PASS, "", log.str());
		}
		// Only present in filtered run (ERROR)
		else if (resCount > 0 && refCount == 0)
		{
			log << "A message was not excluded as it should have been: (" << id << ") with "
				<< glu::getDebugMessageSeverityStr(severity)
				<< ". This message was not present in the reference run";
			return VerificationResult(QP_TEST_RESULT_FAIL, "A message was not filtered out", log.str());
		}
		// Present in both runs (ERROR)
		else
		{
			log << "A message was not excluded as it should have been: (" << id << ") with "
				<< glu::getDebugMessageSeverityStr(severity);
			return VerificationResult(QP_TEST_RESULT_FAIL, "A message was not filtered out", log.str());
		}
	}
}